

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# requantize.cpp
# Opt level: O0

float ncnn::activation_ss(float v,int activation_type,Mat *activation_params)

{
  long *in_RSI;
  int in_EDI;
  float in_XMM0_Da;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float max;
  float min;
  float slope;
  undefined4 local_50;
  undefined4 local_34;
  undefined8 extraout_XMM0_Qb;
  
  if (in_EDI == 1) {
    dVar1 = std::fmax((double)(ulong)(uint)in_XMM0_Da,0.0);
    local_34 = SUB84(dVar1,0);
  }
  else if (in_EDI == 2) {
    local_50 = in_XMM0_Da;
    if (in_XMM0_Da <= 0.0) {
      local_50 = in_XMM0_Da * *(float *)*in_RSI;
    }
    local_34 = local_50;
  }
  else if (in_EDI == 3) {
    local_34 = in_XMM0_Da;
    if (in_XMM0_Da < *(float *)*in_RSI) {
      local_34 = *(float *)*in_RSI;
    }
    if (*(float *)(*in_RSI + 4) < local_34) {
      local_34 = *(float *)(*in_RSI + 4);
    }
  }
  else if (in_EDI == 4) {
    dVar1 = std::exp((double)(ulong)(uint)-in_XMM0_Da);
    local_34 = 1.0 / (SUB84(dVar1,0) + 1.0);
  }
  else {
    local_34 = in_XMM0_Da;
    if (in_EDI == 5) {
      auVar2._0_8_ = std::exp((double)(ulong)(uint)in_XMM0_Da);
      auVar2._8_8_ = extraout_XMM0_Qb;
      auVar3._4_12_ = auVar2._4_12_;
      auVar3._0_4_ = SUB84(auVar2._0_8_,0) + 1.0;
      dVar1 = std::log(auVar3._0_8_);
      dVar1 = std::tanh(dVar1);
      local_34 = in_XMM0_Da * SUB84(dVar1,0);
    }
  }
  return local_34;
}

Assistant:

static inline float activation_ss(float v, int activation_type, const ncnn::Mat& activation_params)
{
    if (activation_type == 1)
    {
        v = fmax(v, 0.f);
    }
    else if (activation_type == 2)
    {
        float slope = activation_params[0];
        v = v > 0.f ? v : v * slope;
    }
    else if (activation_type == 3)
    {
        float min = activation_params[0];
        float max = activation_params[1];
        if (v < min)
            v = min;
        if (v > max)
            v = max;
    }
    else if (activation_type == 4)
    {
        v = 1.f / (1.f + exp(-v));
    }
    else if (activation_type == 5)
    {
        v = v * tanh(log(exp(v) + 1.f));
    }

    return v;
}